

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::detail::GenericFeatureChain::chain_up
          (GenericFeatureChain *this,VkPhysicalDeviceFeatures2 *feats2)

{
  pointer pGVar1;
  reference pvVar2;
  pointer pGVar3;
  GenericFeaturesPNextNode *extension;
  pointer pGVar4;
  
  pGVar1 = (this->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar3 = (pointer)0x0;
  for (pGVar4 = (this->nodes).
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_start; pGVar4 != pGVar1; pGVar4 = pGVar4 + 1) {
    if (pGVar3 != (pointer)0x0) {
      pGVar3->pNext = pGVar4;
    }
    pGVar3 = pGVar4;
  }
  feats2->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
  if ((this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar2 = (reference)0x0;
  }
  else {
    pvVar2 = std::
             vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ::at(&this->nodes,0);
  }
  feats2->pNext = pvVar2;
  return;
}

Assistant:

void GenericFeatureChain::chain_up(VkPhysicalDeviceFeatures2& feats2) noexcept {
    detail::GenericFeaturesPNextNode* prev = nullptr;
    for (auto& extension : nodes) {
        if (prev != nullptr) {
            prev->pNext = &extension;
        }
        prev = &extension;
    }
    feats2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    feats2.pNext = !nodes.empty() ? &nodes.at(0) : nullptr;
}